

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SixAxisForceTorqueSensor.cpp
# Opt level: O0

string * __thiscall
iDynTree::SixAxisForceTorqueSensor::getParentJoint_abi_cxx11_(SixAxisForceTorqueSensor *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(*(long *)(in_RSI + 8) + 0x100));
  return in_RDI;
}

Assistant:

std::string SixAxisForceTorqueSensor::getParentJoint() const
{
    return this->pimpl->parent_junction_name;
}